

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

Operator * __thiscall
parser::Parser::uniary(Operator *__return_storage_ptr__,Parser *this,TokenType t)

{
  pointer pcVar1;
  _Alloc_hider _Var2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  string local_78;
  string local_58;
  string local_38;
  
  if (t == BANG) {
    paVar3 = &local_58.field_2;
    pcVar1 = (this->curToken).Literal._M_dataplus._M_p;
    local_58._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,pcVar1,pcVar1 + (this->curToken).Literal._M_string_length);
    Operator::Operator(__return_storage_ptr__,BANG,&local_58);
    _Var2._M_p = local_58._M_dataplus._M_p;
  }
  else if (t == MINUS) {
    paVar3 = &local_38.field_2;
    local_38._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"-","");
    Operator::Operator(__return_storage_ptr__,UMINUS,&local_38);
    _Var2._M_p = local_38._M_dataplus._M_p;
  }
  else {
    paVar3 = &local_78.field_2;
    pcVar1 = (this->curToken).Literal._M_dataplus._M_p;
    local_78._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,pcVar1,pcVar1 + (this->curToken).Literal._M_string_length);
    Operator::Operator(__return_storage_ptr__,ERROR,&local_78);
    _Var2._M_p = local_78._M_dataplus._M_p;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var2._M_p != paVar3) {
    operator_delete(_Var2._M_p,paVar3->_M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Operator Parser::uniary(TokenType t)
{
    switch (t) {
    case TokenType::MINUS:
       return Operator(TokenType::UMINUS, "-");
    case TokenType::BANG:
        return Operator(TokenType::BANG, curToken.Literal);
    default:
        return Operator(TokenType::ERROR, curToken.Literal);
    }
}